

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_primitive_field_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::RepeatedImmutablePrimitiveFieldLiteGenerator::
GenerateParsingCodeFromPacked(RepeatedImmutablePrimitiveFieldLiteGenerator *this,Printer *printer)

{
  Type type;
  int iVar1;
  int fixed_size;
  Printer *printer_local;
  RepeatedImmutablePrimitiveFieldLiteGenerator *this_local;
  
  io::Printer::Print(printer,&this->variables_,
                     "int length = input.readRawVarint32();\nint limit = input.pushLimit(length);\nif (!$is_mutable$ && input.getBytesUntilLimit() > 0) {\n"
                    );
  type = GetType(this->descriptor_);
  iVar1 = FixedSize(type);
  if (iVar1 == -1) {
    io::Printer::Print(printer,&this->variables_,
                       "  $name$_ =\n      com.google.protobuf.GeneratedMessageLite.mutableCopy($name$_);\n"
                      );
  }
  else {
    io::Printer::Print(printer,&this->variables_,
                       "  final int currentSize = $name$_.size();\n  $name$_ = $name$_.mutableCopyWithCapacity(\n      currentSize + (length/$fixed_size$));\n"
                      );
  }
  io::Printer::Print(printer,&this->variables_,
                     "}\nwhile (input.getBytesUntilLimit() > 0) {\n  $repeated_add$(input.read$capitalized_type$());\n}\ninput.popLimit(limit);\n"
                    );
  return;
}

Assistant:

void RepeatedImmutablePrimitiveFieldLiteGenerator::
GenerateParsingCodeFromPacked(io::Printer* printer) const {
  printer->Print(variables_,
    "int length = input.readRawVarint32();\n"
    "int limit = input.pushLimit(length);\n"
    "if (!$is_mutable$ && input.getBytesUntilLimit() > 0) {\n");

  int fixed_size = FixedSize(GetType(descriptor_));
  if (fixed_size == -1) {
    // TODO(dweis): Scan the input buffer to count, then initialize
    // appropriately.
    printer->Print(variables_,
      "  $name$_ =\n"
      "      com.google.protobuf.GeneratedMessageLite.mutableCopy($name$_);\n");
  } else {
    printer->Print(variables_,
      "  final int currentSize = $name$_.size();\n"
      "  $name$_ = $name$_.mutableCopyWithCapacity(\n"
      "      currentSize + (length/$fixed_size$));\n");
  }

  // TODO(dweis): Scan the input buffer to count and ensure capacity.
  printer->Print(variables_,
    "}\n"
    "while (input.getBytesUntilLimit() > 0) {\n"
    "  $repeated_add$(input.read$capitalized_type$());\n"
    "}\n"
    "input.popLimit(limit);\n");
}